

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL_gpu.c
# Opt level: O2

GPU_BlendMode *
GPU_GetBlendModeFromPreset(GPU_BlendMode *__return_storage_ptr__,GPU_BlendPresetEnum preset)

{
  undefined8 uVar1;
  GPU_BlendFuncEnum GVar2;
  GPU_BlendFuncEnum GVar3;
  GPU_BlendFuncEnum GVar4;
  GPU_BlendFuncEnum GVar5;
  
  switch(preset) {
  case GPU_BLEND_NORMAL:
    GVar2 = GPU_FUNC_SRC_ALPHA;
    GVar3 = GPU_FUNC_ONE_MINUS_SRC_ALPHA;
    GVar4 = GPU_FUNC_SRC_ALPHA;
    GVar5 = GPU_FUNC_ONE_MINUS_SRC_ALPHA;
    break;
  case GPU_BLEND_PREMULTIPLIED_ALPHA:
    GVar2 = GPU_FUNC_ONE;
    GVar3 = GPU_FUNC_ONE_MINUS_SRC_ALPHA;
    GVar4 = GPU_FUNC_ONE;
    GVar5 = GPU_FUNC_ONE_MINUS_SRC_ALPHA;
    break;
  case GPU_BLEND_MULTIPLY:
    GVar2 = GPU_FUNC_DST_COLOR;
    GVar3 = GPU_FUNC_ZERO;
    GVar4 = GPU_FUNC_SRC_ALPHA;
    GVar5 = GPU_FUNC_ONE_MINUS_SRC_ALPHA;
    break;
  case GPU_BLEND_ADD:
    GVar2 = GPU_FUNC_SRC_ALPHA;
    GVar3 = GPU_FUNC_ONE;
    GVar4 = GPU_FUNC_SRC_ALPHA;
    GVar5 = GPU_FUNC_ONE;
    break;
  case GPU_BLEND_SUBTRACT:
    __return_storage_ptr__->source_color = GPU_FUNC_ONE;
    __return_storage_ptr__->dest_color = GPU_FUNC_ONE;
    __return_storage_ptr__->source_alpha = GPU_FUNC_ONE;
    __return_storage_ptr__->dest_alpha = GPU_FUNC_ONE;
    uVar1 = 0x800a0000800a;
    goto LAB_00137ed2;
  case GPU_BLEND_MOD_ALPHA:
    GVar2 = GPU_FUNC_ZERO;
    GVar3 = GPU_FUNC_ONE;
    GVar4 = GPU_FUNC_ZERO;
    GVar5 = GPU_FUNC_SRC_ALPHA;
    break;
  case GPU_BLEND_SET_ALPHA:
    GVar2 = GPU_FUNC_ZERO;
    GVar3 = GPU_FUNC_ONE;
    GVar4 = GPU_FUNC_ONE;
    GVar5 = GPU_FUNC_ZERO;
    break;
  case GPU_BLEND_SET:
    GVar2 = GPU_FUNC_ONE;
    GVar3 = GPU_FUNC_ZERO;
    GVar4 = GPU_FUNC_ONE;
    GVar5 = GPU_FUNC_ZERO;
    break;
  case GPU_BLEND_NORMAL_KEEP_ALPHA:
    GVar2 = GPU_FUNC_SRC_ALPHA;
    GVar3 = GPU_FUNC_ONE_MINUS_SRC_ALPHA;
    GVar4 = GPU_FUNC_ZERO;
    GVar5 = GPU_FUNC_ONE;
    break;
  case GPU_BLEND_NORMAL_ADD_ALPHA:
    GVar2 = GPU_FUNC_SRC_ALPHA;
    GVar3 = GPU_FUNC_ONE_MINUS_SRC_ALPHA;
    GVar4 = GPU_FUNC_ONE;
    GVar5 = GPU_FUNC_ONE;
    break;
  case GPU_BLEND_NORMAL_FACTOR_ALPHA:
    GVar2 = GPU_FUNC_SRC_ALPHA;
    GVar3 = GPU_FUNC_ONE_MINUS_SRC_ALPHA;
    GVar4 = GPU_FUNC_ONE_MINUS_DST_ALPHA;
    GVar5 = GPU_FUNC_ONE;
    break;
  default:
    GPU_PushErrorCode("GPU_GetBlendModeFromPreset",GPU_ERROR_USER_ERROR,
                      "Blend preset not supported: %d");
    __return_storage_ptr__->color_equation = GPU_EQ_ADD;
    __return_storage_ptr__->alpha_equation = GPU_EQ_ADD;
    __return_storage_ptr__->source_color = GPU_FUNC_SRC_ALPHA;
    __return_storage_ptr__->dest_color = GPU_FUNC_ONE_MINUS_SRC_ALPHA;
    __return_storage_ptr__->source_alpha = GPU_FUNC_SRC_ALPHA;
    __return_storage_ptr__->dest_alpha = GPU_FUNC_ONE_MINUS_SRC_ALPHA;
    return __return_storage_ptr__;
  }
  __return_storage_ptr__->source_color = GVar2;
  __return_storage_ptr__->dest_color = GVar3;
  __return_storage_ptr__->source_alpha = GVar4;
  __return_storage_ptr__->dest_alpha = GVar5;
  uVar1 = 0x800600008006;
LAB_00137ed2:
  __return_storage_ptr__->color_equation = (int)uVar1;
  __return_storage_ptr__->alpha_equation = (int)((ulong)uVar1 >> 0x20);
  return __return_storage_ptr__;
}

Assistant:

GPU_BlendMode GPU_GetBlendModeFromPreset(GPU_BlendPresetEnum preset)
{
    switch(preset)
    {
    case GPU_BLEND_NORMAL:
    {
        GPU_BlendMode b = {GPU_FUNC_SRC_ALPHA, GPU_FUNC_ONE_MINUS_SRC_ALPHA, GPU_FUNC_SRC_ALPHA, GPU_FUNC_ONE_MINUS_SRC_ALPHA, GPU_EQ_ADD, GPU_EQ_ADD};
        return b;
    }
    break;
    case GPU_BLEND_PREMULTIPLIED_ALPHA:
    {
        GPU_BlendMode b = {GPU_FUNC_ONE, GPU_FUNC_ONE_MINUS_SRC_ALPHA, GPU_FUNC_ONE, GPU_FUNC_ONE_MINUS_SRC_ALPHA, GPU_EQ_ADD, GPU_EQ_ADD};
        return b;
    }
    break;
    case GPU_BLEND_MULTIPLY:
    {
        GPU_BlendMode b = {GPU_FUNC_DST_COLOR, GPU_FUNC_ZERO, GPU_FUNC_SRC_ALPHA, GPU_FUNC_ONE_MINUS_SRC_ALPHA, GPU_EQ_ADD, GPU_EQ_ADD};
        return b;
    }
    break;
    case GPU_BLEND_ADD:
    {
        GPU_BlendMode b = {GPU_FUNC_SRC_ALPHA, GPU_FUNC_ONE, GPU_FUNC_SRC_ALPHA, GPU_FUNC_ONE, GPU_EQ_ADD, GPU_EQ_ADD};
        return b;
    }
    break;
    case GPU_BLEND_SUBTRACT:
        // FIXME: Use src alpha for source components?
    {
        GPU_BlendMode b = {GPU_FUNC_ONE, GPU_FUNC_ONE, GPU_FUNC_ONE, GPU_FUNC_ONE, GPU_EQ_SUBTRACT, GPU_EQ_SUBTRACT};
        return b;
    }
    break;
    case GPU_BLEND_MOD_ALPHA:
        // Don't disturb the colors, but multiply the dest alpha by the src alpha
    {
        GPU_BlendMode b = {GPU_FUNC_ZERO, GPU_FUNC_ONE, GPU_FUNC_ZERO, GPU_FUNC_SRC_ALPHA, GPU_EQ_ADD, GPU_EQ_ADD};
        return b;
    }
    break;
    case GPU_BLEND_SET_ALPHA:
        // Don't disturb the colors, but set the alpha to the src alpha
    {
        GPU_BlendMode b = {GPU_FUNC_ZERO, GPU_FUNC_ONE, GPU_FUNC_ONE, GPU_FUNC_ZERO, GPU_EQ_ADD, GPU_EQ_ADD};
        return b;
    }
    break;
    case GPU_BLEND_SET:
    {
        GPU_BlendMode b = {GPU_FUNC_ONE, GPU_FUNC_ZERO, GPU_FUNC_ONE, GPU_FUNC_ZERO, GPU_EQ_ADD, GPU_EQ_ADD};
        return b;
    }
    break;
    case GPU_BLEND_NORMAL_KEEP_ALPHA:
    {
        GPU_BlendMode b = {GPU_FUNC_SRC_ALPHA, GPU_FUNC_ONE_MINUS_SRC_ALPHA, GPU_FUNC_ZERO, GPU_FUNC_ONE, GPU_EQ_ADD, GPU_EQ_ADD};
        return b;
    }
    break;
    case GPU_BLEND_NORMAL_ADD_ALPHA:
    {
        GPU_BlendMode b = {GPU_FUNC_SRC_ALPHA, GPU_FUNC_ONE_MINUS_SRC_ALPHA, GPU_FUNC_ONE, GPU_FUNC_ONE, GPU_EQ_ADD, GPU_EQ_ADD};
        return b;
    }
    break;
    case GPU_BLEND_NORMAL_FACTOR_ALPHA:
    {
        GPU_BlendMode b = {GPU_FUNC_SRC_ALPHA, GPU_FUNC_ONE_MINUS_SRC_ALPHA, GPU_FUNC_ONE_MINUS_DST_ALPHA, GPU_FUNC_ONE, GPU_EQ_ADD, GPU_EQ_ADD};
        return b;
    }
    break;
    default:
        GPU_PushErrorCode(__func__, GPU_ERROR_USER_ERROR, "Blend preset not supported: %d", preset);
        {
            GPU_BlendMode b = {GPU_FUNC_SRC_ALPHA, GPU_FUNC_ONE_MINUS_SRC_ALPHA, GPU_FUNC_SRC_ALPHA, GPU_FUNC_ONE_MINUS_SRC_ALPHA, GPU_EQ_ADD, GPU_EQ_ADD};
            return b;
        }
        break;
    }
}